

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_func_queue_examples.cpp
# Opt level: O2

void density_tests::
     SpFunctionQueueSamples<(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1>
     ::func_queue_reentrant_put_samples(ostream *i_ostream)

{
  bool bVar1;
  ostream *poVar2;
  value_type *pvVar3;
  undefined8 *puVar4;
  void *pvVar5;
  int iVar6;
  type return_value;
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  queue;
  double last_val;
  anon_class_8_1_90f47376 func;
  PrintScopeDuration dur;
  undefined1 local_1a0 [32];
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_180;
  reentrant_put_transaction<typename_std::decay<Func>::type> local_d0;
  Func_conflict local_b0;
  PrintScopeDuration local_98 [2];
  
  PrintScopeDuration::PrintScopeDuration
            (local_98,i_ostream,"spin-locking function queue reentrant put samples");
  local_180.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  .
  super_SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_tail = (ControlBlock *)0xffc0;
  LOCK();
  local_180.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  .
  super_SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  UNLOCK();
  local_180.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  .
  super_SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  .m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  reentrant_emplace<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_1_,density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_1_>
            ((sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)&local_180,(anon_class_1_0_00000001 *)local_1a0);
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  reentrant_emplace<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_2_,density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_2_>
            ((sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)&local_180,(anon_class_1_0_00000001 *)local_1a0);
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  reentrant_emplace<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_3_,density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_3_>
            ((sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)&local_180,(anon_class_1_0_00000001 *)local_1a0);
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  reentrant_emplace<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_4_,density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_4_>
            ((sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)&local_180,(anon_class_1_0_00000001 *)local_1a0);
  do {
    bVar1 = density::
            sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
            ::try_reentrant_consume_impl(&local_180);
  } while (bVar1);
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                     *)&local_180);
  local_b0.m_string_1 = (char *)&local_d0;
  local_d0.m_put.m_control_block = (LfQueueControl *)0x3ff0000000000000;
  local_180.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  .
  super_SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_tail = (ControlBlock *)0xffc0;
  LOCK();
  local_180.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  .
  super_SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  UNLOCK();
  local_180.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  .
  super_SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  .m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
  iVar6 = 10;
  while (bVar1 = iVar6 != 0, iVar6 = iVar6 + -1, bVar1) {
    density::
    sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,double()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
    ::
    reentrant_emplace<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_5_,density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_5_&>
              ((sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,double()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
                *)&local_180,(anon_class_8_1_90f47376 *)&local_b0);
  }
  while( true ) {
    density::
    sp_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::try_reentrant_consume_impl
              ((sp_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                *)local_1a0,&local_180);
    if ((__atomic_flag_base)local_1a0[8] == false) break;
    poVar2 = std::ostream::_M_insert<double>((double)local_1a0._0_8_);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                     *)&local_180);
  local_180.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  .
  super_SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_tail = (ControlBlock *)0xffc0;
  LOCK();
  local_180.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  .
  super_SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  UNLOCK();
  local_180.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  .
  super_SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  .m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_1a0._0_4_ = 7;
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  reentrant_emplace<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::Func,int>
            ((sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)&local_180,(int *)local_1a0);
  bVar1 = density::
          sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::try_reentrant_consume_impl(&local_180);
  if (!bVar1) {
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_func_queue_examples.cpp"
                  ,0x1b6,
                  "static void density_tests::SpFunctionQueueSamples<density::function_standard_erasure, density::concurrency_multiple, density::concurrency_multiple>::func_queue_reentrant_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure, PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_180.m_queue);
  local_180.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  .
  super_SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_tail = (ControlBlock *)0xffc0;
  LOCK();
  local_180.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  .
  super_SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  UNLOCK();
  local_180.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  .
  super_SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  .m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_b0.m_string_1 = (char *)0x0;
  local_b0.m_string_2 = (char *)0x0;
  density::
  sp_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  start_reentrant_push<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::Func>
            (&local_d0,&local_180,&local_b0);
  local_1a0._0_8_ = local_d0.m_put.m_control_block;
  local_1a0._8_8_ = local_d0.m_put.m_next_ptr;
  local_1a0._16_8_ = local_d0.m_put.m_user_storage;
  local_1a0._24_8_ = local_d0.m_queue;
  local_d0.m_put.m_user_storage = (__pointer_type)0x0;
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction(&local_d0);
  pvVar3 = density::
           sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<Func>::raw_allocate_copy<char[12]>
                     ((reentrant_put_transaction<Func> *)local_1a0,(char (*) [12])"Hello world");
  puVar4 = (undefined8 *)
           density::
           sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<Func>::element_ptr
                     ((reentrant_put_transaction<Func> *)local_1a0);
  *puVar4 = pvVar3;
  pvVar3 = density::
           sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<Func>::raw_allocate_copy<char[18]>
                     ((reentrant_put_transaction<Func> *)local_1a0,
                      (char (*) [18])"\t(I\'m so happy)!!");
  pvVar5 = density::
           sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<Func>::element_ptr
                     ((reentrant_put_transaction<Func> *)local_1a0);
  *(value_type **)((long)pvVar5 + 8) = pvVar3;
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<Func>::commit((reentrant_put_transaction<Func> *)local_1a0);
  bVar1 = density::
          sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::try_reentrant_consume_impl(&local_180);
  if (!bVar1) {
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_func_queue_examples.cpp"
                  ,0x1dc,
                  "static void density_tests::SpFunctionQueueSamples<density::function_standard_erasure, density::concurrency_multiple, density::concurrency_multiple>::func_queue_reentrant_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure, PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction
            ((reentrant_put_transaction<Func> *)local_1a0);
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_180.m_queue);
  local_180.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  .
  super_SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_tail = (ControlBlock *)0xffc0;
  LOCK();
  local_180.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  .
  super_SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  UNLOCK();
  local_180.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  .
  super_SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  .m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
  density::
  sp_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  start_reentrant_emplace<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::Func>
            (&local_d0,&local_180);
  local_1a0._0_8_ = local_d0.m_put.m_control_block;
  local_1a0._8_8_ = local_d0.m_put.m_next_ptr;
  local_1a0._16_8_ = local_d0.m_put.m_user_storage;
  local_1a0._24_8_ = local_d0.m_queue;
  local_d0.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction(&local_d0);
  pvVar3 = density::
           sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<Func>::raw_allocate_copy<char[12]>
                     ((reentrant_put_transaction<Func> *)local_1a0,(char (*) [12])"Hello world");
  puVar4 = (undefined8 *)
           density::
           sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<Func>::element_ptr
                     ((reentrant_put_transaction<Func> *)local_1a0);
  *puVar4 = pvVar3;
  pvVar3 = density::
           sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<Func>::raw_allocate_copy<char[18]>
                     ((reentrant_put_transaction<Func> *)local_1a0,
                      (char (*) [18])"\t(I\'m so happy)!!");
  pvVar5 = density::
           sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<Func>::element_ptr
                     ((reentrant_put_transaction<Func> *)local_1a0);
  *(value_type **)((long)pvVar5 + 8) = pvVar3;
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<Func>::commit((reentrant_put_transaction<Func> *)local_1a0);
  bVar1 = density::
          sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::try_reentrant_consume_impl(&local_180);
  if (bVar1) {
    density::
    sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<Func>::~reentrant_put_transaction
              ((reentrant_put_transaction<Func> *)local_1a0);
    density::
    sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::~sp_heter_queue(&local_180.m_queue);
    PrintScopeDuration::~PrintScopeDuration(local_98);
    return;
  }
  __assert_fail("invoked",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_func_queue_examples.cpp"
                ,0x200,
                "static void density_tests::SpFunctionQueueSamples<density::function_standard_erasure, density::concurrency_multiple, density::concurrency_multiple>::func_queue_reentrant_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure, PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
               );
}

Assistant:

static void func_queue_reentrant_put_samples(std::ostream & i_ostream)
        {
            PrintScopeDuration dur(i_ostream, "spin-locking function queue reentrant put samples");

            using namespace density;

            {
                //! [sp_function_queue reentrant_push example 1]
                sp_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>
                  queue;
                queue.reentrant_push([] { std::cout << "Hello"; });
                queue.reentrant_push([] { std::cout << " world"; });
                queue.reentrant_push([] { std::cout << "!!!"; });
                queue.reentrant_push([] { std::cout << std::endl; });
                while (queue.try_reentrant_consume())
                    ;
                //! [sp_function_queue reentrant_push example 1]
            }
            {
                //! [sp_function_queue reentrant_push example 2]
                double last_val = 1.;

                auto func = [&last_val] { return last_val /= 2.; };

                sp_function_queue<
                  double(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>
                  queue;
                for (int i = 0; i < 10; i++)
                    queue.reentrant_push(func);

                while (auto const return_value = queue.try_reentrant_consume())
                    std::cout << *return_value << std::endl;
                //! [sp_function_queue reentrant_push example 2]
            }
            {
                //! [sp_function_queue reentrant_emplace example 1]
                /* This local struct is unmovable and uncopyable, so emplace is the only
                    option to add it to the queue. Note that operator () returns an int,
                    but we add it to a void() function queue. This is ok, as we are just
                    discarding the return value. */
                struct Func
                {
                    int const m_value;

                    Func(int i_value) : m_value(i_value) {}

                    Func(const Func &) = delete;
                    Func & operator=(const Func &) = delete;

                    int operator()() const
                    {
                        std::cout << m_value << std::endl;
                        return m_value;
                    }
                };

                sp_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>
                  queue;
                queue.template reentrant_emplace<Func>(7);

                bool const invoked = queue.try_reentrant_consume();
                assert(invoked);
                //! [sp_function_queue reentrant_emplace example 1]
                (void)invoked;
            }
            {
                //! [sp_function_queue start_reentrant_push example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                sp_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>
                  queue;

                auto transaction = queue.start_reentrant_push(Func{});

                // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                transaction.element().m_string_2 =
                  transaction.raw_allocate_copy("\t(I'm so happy)!!");

                transaction.commit();

                // now transaction is empty

                bool const invoked = queue.try_reentrant_consume();
                assert(invoked);
                //! [sp_function_queue start_reentrant_push example 1]
                (void)invoked;
            }
            {
                //! [sp_function_queue start_reentrant_emplace example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                sp_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>
                  queue;

                auto transaction = queue.template start_reentrant_emplace<Func>();

                // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                transaction.element().m_string_2 =
                  transaction.raw_allocate_copy("\t(I'm so happy)!!");

                transaction.commit();

                bool const invoked = queue.try_reentrant_consume();
                assert(invoked);
                //! [sp_function_queue start_reentrant_emplace example 1]
                (void)invoked;
            }
        }